

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Instance>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *vk;
  long *plVar1;
  VkInstance_s *pVVar2;
  DestroyInstanceFunc p_Var3;
  pointer pSVar4;
  VkAllocationCallbacks *pVVar5;
  size_t sVar6;
  size_t sVar7;
  char *__s;
  size_t sVar8;
  undefined8 *puVar9;
  long *plVar10;
  int *piVar11;
  size_type sVar12;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
  objects;
  VkApplicationInfo appInfo_1;
  AllocationCallbackRecorder allocRecorder;
  Move<vk::VkInstance_s_*> local_258;
  size_type local_240;
  TestStatus *local_238;
  PlatformInterface *local_230;
  pointer local_228;
  void *pvStack_220;
  char *local_218;
  undefined8 uStack_210;
  char *local_208;
  undefined8 uStack_200;
  VkInstanceCreateInfo local_1f8;
  undefined1 local_1b8 [8];
  VkAllocationCallbacks VStack_1b0;
  VkAllocationCallbacks *pVStack_180;
  ios_base local_140 [272];
  
  local_238 = __return_storage_ptr__;
  pVVar5 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b8,pVVar5,0x400);
  vk = context->m_platformInterface;
  Context::getDeviceInterface(context);
  Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  sVar6 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b8);
  local_1f8.pApplicationInfo = (VkApplicationInfo *)&local_228;
  local_208 = (char *)0x0;
  local_218 = (char *)0x0;
  uStack_210 = 0;
  local_228 = (pointer)0x0;
  pvStack_220 = (pointer)0x0;
  uStack_200 = 0x40000000000000;
  local_1f8.pNext = (void *)0x0;
  local_1f8.flags = 0;
  local_1f8._20_4_ = 0;
  local_1f8.enabledExtensionCount = 0;
  local_1f8._52_4_ = 0;
  local_1f8.ppEnabledExtensionNames = (char **)0x0;
  local_1f8.enabledLayerCount = 0;
  local_1f8._36_4_ = 0;
  local_1f8.ppEnabledLayerNames = (char **)0x0;
  local_1f8.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_1f8._4_4_ = 0;
  ::vk::createInstance(&local_258,vk,&local_1f8,&VStack_1b0);
  pVVar5 = local_258.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator;
  p_Var3 = local_258.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance;
  pVVar2 = local_258.super_RefBase<vk::VkInstance_s_*>.m_data.object;
  sVar7 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b8);
  if (pVVar2 != (VkInstance)0x0) {
    (*p_Var3)(pVVar2,pVVar5);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b8);
  sVar6 = getSafeObjectCount((Context *)context->m_testCtx->m_platform,sVar7 - sVar6,0);
  local_240 = 0x20;
  if (sVar6 < 0x20) {
    local_240 = sVar6;
  }
  local_230 = context->m_platformInterface;
  Context::getDeviceInterface(context);
  Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
            *)&local_228,local_240,(allocator_type *)local_1b8);
  local_1b8 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&VStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&VStack_1b0,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)&VStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&VStack_1b0," ",1);
  __s = ::vk::getTypeName<vk::VkInstance_s*>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)&VStack_1b0 + (int)*(undefined8 *)((long)VStack_1b0.pUserData + -0x18));
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&VStack_1b0,__s,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&VStack_1b0," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&VStack_1b0);
  std::ios_base::~ios_base(local_140);
  if (sVar6 != 0) {
    local_240 = local_240 << 4;
    sVar12 = 0;
    do {
      puVar9 = (undefined8 *)operator_new(0x18);
      local_1f8.enabledLayerCount = 0;
      local_1f8._36_4_ = 0;
      local_1f8.flags = 0;
      local_1f8._20_4_ = 0;
      local_1f8.pApplicationInfo = (VkApplicationInfo *)0x0;
      local_1f8.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      local_1f8._4_4_ = 0;
      local_1f8.pNext = (void *)0x0;
      local_1f8.ppEnabledLayerNames = (char **)0x40000000000000;
      VStack_1b0.pUserData = (void *)0x0;
      VStack_1b0.pfnAllocation = (PFN_vkAllocationFunction)0x0;
      VStack_1b0.pfnInternalFree = (PFN_vkInternalFreeNotification)0x0;
      pVStack_180 = (VkAllocationCallbacks *)0x0;
      VStack_1b0.pfnFree = (PFN_vkFreeFunction)0x0;
      VStack_1b0.pfnInternalAllocation = (PFN_vkInternalAllocationNotification)0x0;
      local_1b8 = (undefined1  [8])&DAT_00000001;
      VStack_1b0.pfnReallocation = (PFN_vkReallocationFunction)&local_1f8;
      ::vk::createInstance
                (&local_258,local_230,(VkInstanceCreateInfo *)local_1b8,(VkAllocationCallbacks *)0x0
                );
      puVar9[2] = local_258.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator;
      *puVar9 = local_258.super_RefBase<vk::VkInstance_s_*>.m_data.object;
      puVar9[1] = local_258.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance;
      local_258.super_RefBase<vk::VkInstance_s_*>.m_data.object = (VkInstance)0x0;
      local_258.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance =
           (DestroyInstanceFunc)0x0;
      local_258.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      plVar10 = (long *)operator_new(0x20);
      pSVar4 = local_228;
      *(undefined4 *)(plVar10 + 1) = 0;
      *(undefined4 *)((long)plVar10 + 0xc) = 0;
      *plVar10 = (long)&PTR__SharedPtrState_00cef030;
      plVar10[2] = (long)puVar9;
      *(undefined4 *)(plVar10 + 1) = 1;
      *(undefined4 *)((long)plVar10 + 0xc) = 1;
      plVar1 = *(long **)((long)&local_228->m_state + sVar12);
      if (plVar1 != plVar10) {
        if (plVar1 != (long *)0x0) {
          LOCK();
          plVar1 = plVar1 + 1;
          *(int *)plVar1 = (int)*plVar1 + -1;
          UNLOCK();
          if ((int)*plVar1 == 0) {
            *(undefined8 *)((long)&local_228->m_ptr + sVar12) = 0;
            (**(code **)(**(long **)((long)&local_228->m_state + sVar12) + 0x10))();
          }
          LOCK();
          piVar11 = (int *)(*(long *)((long)&pSVar4->m_state + sVar12) + 0xc);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            plVar1 = *(long **)((long)&pSVar4->m_state + sVar12);
            if (plVar1 != (long *)0x0) {
              (**(code **)(*plVar1 + 8))();
            }
            *(undefined8 *)((long)&pSVar4->m_state + sVar12) = 0;
          }
        }
        *(undefined8 **)((long)&pSVar4->m_ptr + sVar12) = puVar9;
        *(long **)((long)&pSVar4->m_state + sVar12) = plVar10;
        LOCK();
        *(int *)(plVar10 + 1) = (int)plVar10[1] + 1;
        UNLOCK();
        LOCK();
        piVar11 = (int *)(*(long *)((long)&pSVar4->m_state + sVar12) + 0xc);
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      plVar1 = plVar10 + 1;
      LOCK();
      *(int *)plVar1 = (int)*plVar1 + -1;
      UNLOCK();
      if ((int)*plVar1 == 0) {
        (**(code **)(*plVar10 + 0x10))(plVar10);
      }
      piVar11 = (int *)((long)plVar10 + 0xc);
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        (**(code **)(*plVar10 + 8))(plVar10);
      }
      if (local_258.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0) {
        (*local_258.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
                  (local_258.super_RefBase<vk::VkInstance_s_*>.m_data.object,
                   local_258.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
      }
      sVar12 = sVar12 + 0x10;
    } while (local_240 != sVar12);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
                     *)&local_228,local_228);
  local_1b8 = (undefined1  [8])&VStack_1b0.pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Ok","");
  local_238->m_code = QP_TEST_RESULT_PASS;
  (local_238->m_description)._M_dataplus._M_p = (pointer)&(local_238->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238->m_description,local_1b8,
             (undefined1 *)((long)VStack_1b0.pUserData + (long)local_1b8));
  if (local_1b8 != (undefined1  [8])&VStack_1b0.pfnAllocation) {
    operator_delete((void *)local_1b8,(ulong)(VStack_1b0.pfnAllocation + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
             *)&local_228);
  return local_238;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}